

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O0

void __thiscall
pbrt::Tokenizer::Tokenizer
          (Tokenizer *this,string *str,string *filename,
          function<void_(const_char_*,_const_pbrt::FileLoc_*)> *errorCallback)

{
  string_view filename_00;
  string *this_00;
  size_t sVar1;
  long lVar2;
  Tokenizer *this_01;
  string *in_RDX;
  string *in_RSI;
  size_t *in_RDI;
  long in_FS_OFFSET;
  function<void_(const_char_*,_const_pbrt::FileLoc_*)> *in_stack_ffffffffffffff48;
  function<void_(const_char_*,_const_pbrt::FileLoc_*)> *in_stack_ffffffffffffff50;
  int len;
  size_t *ptr;
  FileLoc local_38 [2];
  
  FileLoc::FileLoc((FileLoc *)in_stack_ffffffffffffff50);
  std::function<void_(const_char_*,_const_pbrt::FileLoc_*)>::function
            (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
  in_RDI[7] = 0;
  in_RDI[8] = 0;
  std::__cxx11::string::string((string *)(in_RDI + 9),in_RSI);
  std::__cxx11::string::string((string *)(in_RDI + 0xf));
  this_00 = (string *)operator_new(0x20);
  std::__cxx11::string::string(this_00,in_RDX);
  filename_00 = (string_view)std::__cxx11::string::operator_cast_to_basic_string_view(this_00);
  FileLoc::FileLoc(local_38,filename_00);
  in_RDI[2] = local_38[0]._16_8_;
  *in_RDI = local_38[0].filename._M_len;
  in_RDI[1] = (size_t)local_38[0].filename._M_str;
  ptr = in_RDI + 9;
  sVar1 = std::__cxx11::string::data();
  in_RDI[0xd] = sVar1;
  sVar1 = in_RDI[0xd];
  lVar2 = std::__cxx11::string::size();
  in_RDI[0xe] = sVar1 + lVar2;
  lVar2 = std::__cxx11::string::size();
  len = (int)(sVar1 >> 0x20);
  *(long *)(in_FS_OFFSET + -0x298) = *(long *)(in_FS_OFFSET + -0x298) + lVar2;
  this_01 = (Tokenizer *)std::__cxx11::string::data();
  std::__cxx11::string::size();
  CheckUTF(this_01,ptr,len);
  return;
}

Assistant:

Tokenizer::Tokenizer(std::string str, std::string filename,
                     std::function<void(const char *, const FileLoc *)> errorCallback)
    : errorCallback(std::move(errorCallback)), contents(std::move(str)) {
    loc = FileLoc(*new std::string(filename));
    pos = contents.data();
    end = pos + contents.size();
    tokenizerMemory += contents.size();
    CheckUTF(contents.data(), contents.size());
}